

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

bool __thiscall libcellml::Model::removeUnits(Model *this,string *name)

{
  shared_ptr<libcellml::Units> *psVar1;
  const_iterator __position;
  UnitsImpl *this_00;
  
  __position = ModelImpl::findUnits
                         ((ModelImpl *)
                          (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                          super_Entity.mPimpl,name);
  psVar1 = (shared_ptr<libcellml::Units> *)
           (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
           [4].mId.field_2._M_allocated_capacity;
  if (__position._M_current != psVar1) {
    this_00 = Units::pFunc(((__position._M_current)->
                           super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    _M_erase((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              *)&(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
                 mPimpl[4].mId._M_string_length,(iterator)__position._M_current);
  }
  return __position._M_current != psVar1;
}

Assistant:

bool Model::removeUnits(const std::string &name)
{
    bool status = false;
    auto result = pFunc()->findUnits(name);
    if (result != pFunc()->mUnits.end()) {
        (*result)->pFunc()->removeParent();
        pFunc()->mUnits.erase(result);
        status = true;
    }

    return status;
}